

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::checkNextPragmaToken(Preprocessor *this)

{
  bool bVar1;
  size_type delta;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar3;
  bool local_81;
  void *local_80;
  bool local_71;
  SimplePragmaExpressionSyntax *local_70;
  SourceLocation local_68;
  undefined1 local_60 [8];
  Token expected;
  string_view local_40;
  SourceLocation local_30;
  SourceLocation local_28;
  SourceLocation loc;
  Preprocessor *this_local;
  bool local_10;
  
  loc = (SourceLocation)this;
  bVar1 = peekSameLine(this);
  if (bVar1) {
    local_80 = (void *)0x0;
    local_81 = true;
    std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::pair<std::nullptr_t,_bool,_true>
              ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)&this_local,&local_80,
               &local_81);
    uVar2 = extraout_RDX_00;
  }
  else {
    local_30 = Token::location(&this->lastConsumed);
    local_40 = Token::rawText(&this->lastConsumed);
    delta = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_40);
    expected.info = (Info *)SourceLocation::operator+(&local_30,delta);
    local_28 = (SourceLocation)expected.info;
    addDiag(this,(DiagCode)0x80004,(SourceLocation)expected.info);
    local_68 = local_28;
    _local_60 = Token::createMissing(this->alloc,Identifier,local_28);
    local_70 = BumpAllocator::
               emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                         (this->alloc,(Token *)local_60);
    local_71 = false;
    std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
    pair<slang::syntax::SimplePragmaExpressionSyntax_*,_bool,_true>
              ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)&this_local,&local_70,
               &local_71);
    uVar2 = extraout_RDX;
  }
  pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  pVar3.second = local_10;
  pVar3.first = (PragmaExpressionSyntax *)this_local;
  return pVar3;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::checkNextPragmaToken() {
    if (!peekSameLine()) {
        auto loc = lastConsumed.location() + lastConsumed.rawText().length();
        addDiag(diag::ExpectedPragmaExpression, loc);

        auto expected = Token::createMissing(alloc, TokenKind::Identifier, loc);
        return {alloc.emplace<SimplePragmaExpressionSyntax>(expected), false};
    }
    return {nullptr, true};
}